

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

void __thiscall
dlib::
array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
::push_back(array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this,unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
                  *item)

{
  int iVar1;
  unsigned_long uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RSI;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  unsigned_long i;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  temp;
  unsigned_long in_stack_00000188;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_00000190;
  unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
  *in_stack_ffffffffffffff38;
  unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>
  *in_stack_ffffffffffffff40;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_ffffffffffffff50;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_ffffffffffffff58;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_ffffffffffffff60;
  unsigned_long local_68;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  local_50;
  array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *local_10;
  
  local_10 = in_RSI;
  uVar2 = max_size(in_RDI);
  iVar1 = (*(in_RDI->
            super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
            )._vptr_enumerable[8])();
  if (uVar2 == CONCAT44(extraout_var,iVar1)) {
    array(in_stack_ffffffffffffff50);
    (*(in_RDI->
      super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
      )._vptr_enumerable[8])();
    set_max_size(in_stack_ffffffffffffff60,(unsigned_long)in_stack_ffffffffffffff58);
    (*(in_RDI->
      super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
      )._vptr_enumerable[8])();
    set_size(in_stack_00000190,in_stack_00000188);
    local_68 = 0;
    while( true ) {
      iVar1 = (*(in_RDI->
                super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
                )._vptr_enumerable[8])();
      if (CONCAT44(extraout_var_00,iVar1) <= local_68) break;
      in_stack_ffffffffffffff60 =
           (array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            *)operator[](in_RDI,local_68);
      in_stack_ffffffffffffff58 =
           (array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            *)operator[](&local_50,local_68);
      exchange<std::unique_ptr<dlib::thread_function,std::default_delete<dlib::thread_function>>>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_68 = local_68 + 1;
    }
    uVar2 = size(&local_50);
    operator[](&local_50,uVar2 - 1);
    exchange<std::unique_ptr<dlib::thread_function,std::default_delete<dlib::thread_function>>>
              ((unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)
               local_10,in_stack_ffffffffffffff38);
    swap(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    ~array(local_10);
  }
  else {
    (*(in_RDI->
      super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
      )._vptr_enumerable[8])();
    set_size(in_stack_00000190,in_stack_00000188);
    iVar1 = (*(in_RDI->
              super_enumerable<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>_>
              )._vptr_enumerable[8])();
    operator[](in_RDI,CONCAT44(extraout_var_01,iVar1) - 1);
    exchange<std::unique_ptr<dlib::thread_function,std::default_delete<dlib::thread_function>>>
              (in_stack_ffffffffffffff40,
               (unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> *)
               local_10);
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    push_back (
        T& item
    ) 
    {
        if (this->max_size() == this->size())
        {
            // double the size of the array
            array temp;
            temp.set_max_size(this->size()*2 + 1);
            temp.set_size(this->size()+1);
            for (unsigned long i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            exchange(item,temp[temp.size()-1]);
            temp.swap(*this);
        }
        else
        {
            this->set_size(this->size()+1);
            exchange(item,(*this)[this->size()-1]);
        }
    }